

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::tessellation::anon_unknown_2::IdentityTessellationShaderTestCase::createInstance
          (IdentityTessellationShaderTestCase *this,Context *context)

{
  vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *this_00;
  PassthroughTestInstance *this_01;
  Params params;
  Vector<float,_4> local_158;
  undefined1 local_148 [64];
  PipelineDescription local_108;
  PipelineDescription local_a0;
  char local_38 [32];
  
  PassthroughTestInstance::Params::Params((Params *)local_148);
  local_148[0] = false;
  local_148._28_4_ = this->m_primitiveType;
  local_148._32_4_ = (local_148._28_4_ == TESSPRIMITIVETYPE_TRIANGLES) + 2;
  this_00 = (vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)(local_148 + 0x28);
  local_158.m_data[0] = -0.4;
  local_158.m_data[1] = 0.4;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = -0.5;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  if (local_148._32_4_ == 3) {
    local_158.m_data[0] = 0.4;
    local_158.m_data[1] = 0.4;
    local_158.m_data[2] = 0.0;
    local_158.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  }
  local_108.useTessellation = true;
  local_108.useGeometry = true;
  std::__cxx11::string::assign((char *)&local_108.tessEvalShaderName);
  std::__cxx11::string::assign((char *)&local_108.geomShaderName);
  std::__cxx11::string::assign((char *)&local_108.description);
  local_a0.useTessellation = false;
  local_a0.useGeometry = true;
  std::__cxx11::string::assign((char *)&local_a0.tessEvalShaderName);
  std::__cxx11::string::assign((char *)&local_a0.geomShaderName);
  std::__cxx11::string::assign((char *)&local_a0.description);
  std::__cxx11::string::assign(local_38);
  this_01 = (PassthroughTestInstance *)operator_new(0x140);
  PassthroughTestInstance::PassthroughTestInstance(this_01,context,(Params *)local_148);
  PassthroughTestInstance::Params::~Params((Params *)local_148);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* IdentityTessellationShaderTestCase::createInstance (Context& context) const
{
	PassthroughTestInstance::Params params;

	params.useTessLevels	   = false;
	params.primitiveType	   = m_primitiveType;
	params.inputPatchVertices  = (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

	params.vertices.push_back(	  tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f ));
	params.vertices.push_back(	  tcu::Vec4(  0.0f, -0.5f, 0.0f, 1.0f ));
	if (params.inputPatchVertices == 3)
		params.vertices.push_back(tcu::Vec4(  0.4f,  0.4f, 0.0f, 1.0f ));

	params.pipelineCases[0].useTessellation		= true;
	params.pipelineCases[0].useGeometry			= true;
	params.pipelineCases[0].tessEvalShaderName	= "tese";
	params.pipelineCases[0].geomShaderName		= "geom_from_tese";
	params.pipelineCases[0].description			= "passthrough tessellation shaders";

	params.pipelineCases[1].useTessellation		= false;
	params.pipelineCases[1].useGeometry			= true;
	params.pipelineCases[1].tessEvalShaderName	= "tese";
	params.pipelineCases[1].geomShaderName		= "geom_from_vert";
	params.pipelineCases[1].description			= "no tessellation shaders in the pipeline";

	params.message = "Testing geometry shading shader program output does not change when a passthrough tessellation shader is attached.\n"
					 "Rendering two images, first with and second without a tessellation shader. Expecting similar results.\n"
					 "Using additive blending to detect overlap.\n";

	return new PassthroughTestInstance(context, params);
}